

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMapFromNativeAddress
          (FunctionBody *this,DWORD_PTR codeAddress,StatementData *data,uint loopNum,
          FunctionBody *inlinee)

{
  int iVar1;
  BOOL BVar2;
  FunctionBody *this_00;
  SmallSpanSequence *pThrowSpanSequence;
  DWORD_PTR DVar3;
  FunctionBody *pFVar4;
  
  pFVar4 = this;
  if (loopNum == 0xffffffff) {
    this_00 = (FunctionBody *)GetEntryPointFromNativeAddress(this,codeAddress);
  }
  else {
    this_00 = (FunctionBody *)GetLoopEntryPointInfoFromNativeAddress(this,codeAddress,loopNum);
  }
  if (this_00 == (FunctionBody *)0x0) {
    iVar1 = 0;
    pThrowSpanSequence = (SmallSpanSequence *)0x0;
  }
  else {
    pThrowSpanSequence = EntryPointInfo::GetNativeThrowSpanSequence((EntryPointInfo *)this_00);
    DVar3 = EntryPointInfo::GetNativeAddress((EntryPointInfo *)this_00);
    iVar1 = (int)DVar3;
    pFVar4 = this_00;
  }
  iVar1 = GetStatementIndexFromNativeOffset(pFVar4,pThrowSpanSequence,(int)codeAddress - iVar1);
  BVar2 = GetMatchingStatementMap(this,data,iVar1,inlinee);
  return BVar2;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMapFromNativeAddress(DWORD_PTR codeAddress, StatementData &data, uint loopNum, FunctionBody *inlinee /* = nullptr */)
    {
        SmallSpanSequence * spanSequence = nullptr;
        DWORD_PTR nativeBaseAddress = NULL;

        EntryPointInfo * entryPoint;
        if (loopNum == -1)
        {
            entryPoint = GetEntryPointFromNativeAddress(codeAddress);
        }
        else
        {
            entryPoint = GetLoopEntryPointInfoFromNativeAddress(codeAddress, loopNum);
        }

        if (entryPoint != nullptr)
        {
            spanSequence = entryPoint->GetNativeThrowSpanSequence();
            nativeBaseAddress = entryPoint->GetNativeAddress();
        }

        int statementIndex = GetStatementIndexFromNativeAddress(spanSequence, codeAddress, nativeBaseAddress);

        return GetMatchingStatementMap(data, statementIndex, inlinee);
    }